

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

int Disto16x16_SSE2(uint8_t *a,uint8_t *b,uint16_t *w)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar2 = 0;
  uVar4 = 0;
  do {
    uVar3 = 0;
    do {
      iVar1 = Disto4x4_SSE2(a + uVar3,b + uVar3,w);
      iVar2 = iVar2 + iVar1;
      bVar5 = uVar3 < 0xc;
      uVar3 = uVar3 + 4;
    } while (bVar5);
    a = a + 0x80;
    b = b + 0x80;
    bVar5 = uVar4 < 0x180;
    uVar4 = uVar4 + 0x80;
  } while (bVar5);
  return iVar2;
}

Assistant:

static int Disto16x16_SSE2(const uint8_t* WEBP_RESTRICT const a,
                           const uint8_t* WEBP_RESTRICT const b,
                           const uint16_t* WEBP_RESTRICT const w) {
  int D = 0;
  int x, y;
  for (y = 0; y < 16 * BPS; y += 4 * BPS) {
    for (x = 0; x < 16; x += 4) {
      D += Disto4x4_SSE2(a + x + y, b + x + y, w);
    }
  }
  return D;
}